

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_common.h
# Opt level: O2

void VP8LPrefixEncodeBits(int distance,int *code,int *extra_bits)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (distance < 0x200) {
    cVar1 = kPrefixEncodeCode[distance].extra_bits_;
    *code = (int)kPrefixEncodeCode[distance].code_;
    *extra_bits = (int)cVar1;
    return;
  }
  uVar4 = distance - 1;
  uVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar3 = 0x1e - (uVar2 ^ 0x1f);
  *extra_bits = uVar3;
  *code = (uint)((uVar4 >> (uVar3 & 0x1f) & 1) != 0) + (uVar2 ^ 0x1f) * 2 ^ 0x3e;
  return;
}

Assistant:

static WEBP_INLINE void VP8LPrefixEncodeBits(int distance, int* const code,
                                             int* const extra_bits) {
  if (distance < PREFIX_LOOKUP_IDX_MAX) {
    const VP8LPrefixCode prefix_code = kPrefixEncodeCode[distance];
    *code = prefix_code.code_;
    *extra_bits = prefix_code.extra_bits_;
  } else {
    VP8LPrefixEncodeBitsNoLUT(distance, code, extra_bits);
  }
}